

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c
# Opt level: O3

void golf_json_object_set_data(JSON_Object *obj,char *name,uchar *data,int data_len)

{
  uchar *string;
  int enc_len;
  int local_1c;
  
  string = golf_base64_encode(data,data_len,&local_1c);
  if (string == (uchar *)0x0) {
    golf_log_warning("Failed to encode data in field %s",name);
  }
  json_object_set_string(obj,name,(char *)string);
  golf_free_tracked(string);
  return;
}

Assistant:

void golf_json_object_set_data(JSON_Object *obj, const char *name, unsigned char *data, int data_len) {
    int enc_len;
    unsigned char *enc_data = golf_base64_encode(data, data_len, &enc_len);
    if (!enc_data) {
        golf_log_warning("Failed to encode data in field %s", name);
    }
    json_object_set_string(obj, name, (char*)enc_data);
    golf_free(enc_data);
}